

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[32],unsigned_long,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [11],uint *RestArgs,char (*RestArgs_1) [33],
               unsigned_long *RestArgs_2,char (*RestArgs_3) [11],unsigned_long *RestArgs_4,
               char (*RestArgs_5) [32],unsigned_long *RestArgs_6,char (*RestArgs_7) [2])

{
  char (*RestArgs_local_3) [11];
  unsigned_long *RestArgs_local_2;
  char (*RestArgs_local_1) [33];
  uint *RestArgs_local;
  char (*FirstArg_local) [11];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[11]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[32],unsigned_long,char[2]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}